

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

PipelineFor<DynamicCapability> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicCapability> *__return_storage_ptr__,Pipeline *pipeline)

{
  Client *pCVar1;
  Fault local_20;
  Fault f;
  Pipeline *pipeline_local;
  
  f.exception = (Exception *)pipeline;
  if (pipeline->type == CAPABILITY) {
    pCVar1 = kj::mv<capnp::DynamicCapability::Client>(&(pipeline->field_1).capabilityValue);
    DynamicCapability::Client::Client(__return_storage_ptr__,pCVar1);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x72b,FAILED,"pipeline.type == CAPABILITY","\"Pipeline type mismatch.\"",
               (char (*) [24])"Pipeline type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x0;
    DynamicCapability::Client::Client(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineFor<DynamicCapability> DynamicValue::Pipeline::AsImpl<DynamicCapability>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == CAPABILITY, "Pipeline type mismatch.") {
    return DynamicCapability::Client();
  }
  return kj::mv(pipeline.capabilityValue);
}